

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataBuffer.cpp
# Opt level: O3

void __thiscall DataBuffer::DataBuffer(DataBuffer *this,int size)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = -1;
  if (-1 < size) {
    iVar1 = size;
  }
  pcVar2 = (char *)operator_new__((long)iVar1);
  this->m_buffer = pcVar2;
  this->m_allocatedSize = size;
  this->m_position = pcVar2;
  (this->m_marks)._deque.super__Deque_base<ByteMark_*,_std::allocator<ByteMark_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_marks)._deque.super__Deque_base<ByteMark_*,_std::allocator<ByteMark_*>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->m_marks)._deque.super__Deque_base<ByteMark_*,_std::allocator<ByteMark_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_marks)._deque.super__Deque_base<ByteMark_*,_std::allocator<ByteMark_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_marks)._deque.super__Deque_base<ByteMark_*,_std::allocator<ByteMark_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_marks)._deque.super__Deque_base<ByteMark_*,_std::allocator<ByteMark_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_marks)._deque.super__Deque_base<ByteMark_*,_std::allocator<ByteMark_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_marks)._deque.super__Deque_base<ByteMark_*,_std::allocator<ByteMark_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_marks)._deque.super__Deque_base<ByteMark_*,_std::allocator<ByteMark_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_marks)._deque.super__Deque_base<ByteMark_*,_std::allocator<ByteMark_*>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<ByteMark_*,_std::allocator<ByteMark_*>_>::_M_initialize_map
            ((_Deque_base<ByteMark_*,_std::allocator<ByteMark_*>_> *)&this->m_marks,0);
  (this->m_references)._deque.super__Deque_base<MarkReference_*,_std::allocator<MarkReference_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_references)._deque.super__Deque_base<MarkReference_*,_std::allocator<MarkReference_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->m_references)._deque.super__Deque_base<MarkReference_*,_std::allocator<MarkReference_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_references)._deque.super__Deque_base<MarkReference_*,_std::allocator<MarkReference_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_references)._deque.super__Deque_base<MarkReference_*,_std::allocator<MarkReference_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_references)._deque.super__Deque_base<MarkReference_*,_std::allocator<MarkReference_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_references)._deque.super__Deque_base<MarkReference_*,_std::allocator<MarkReference_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_references)._deque.super__Deque_base<MarkReference_*,_std::allocator<MarkReference_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_references)._deque.super__Deque_base<MarkReference_*,_std::allocator<MarkReference_*>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_references)._deque.super__Deque_base<MarkReference_*,_std::allocator<MarkReference_*>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<MarkReference_*,_std::allocator<MarkReference_*>_>::_M_initialize_map
            ((_Deque_base<MarkReference_*,_std::allocator<MarkReference_*>_> *)&this->m_references,0
            );
  return;
}

Assistant:

DataBuffer::DataBuffer (int size) :
	m_buffer (new char[size]),
	m_allocatedSize (size),
	m_position (&buffer()[0]) {}